

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

string * __thiscall
google::protobuf::DescriptorPool::Tables::
AllocateStringArray<google::protobuf::stringpiece_internal::StringPiece&,google::protobuf::stringpiece_internal::StringPiece&>
          (Tables *this,StringPiece *values,StringPiece *values_1)

{
  char *pcVar1;
  string *psVar2;
  long lVar3;
  string local_58;
  string local_38;
  
  psVar2 = (string *)anon_unknown_1::TableArena::AllocRawInternal(&this->arena_,0x40,'\x02');
  (psVar2->_M_dataplus)._M_p = (pointer)0x0;
  psVar2->_M_string_length = 0;
  (psVar2->field_2)._M_allocated_capacity = 0;
  *(undefined8 *)((long)&psVar2->field_2 + 8) = 0;
  psVar2[1]._M_dataplus._M_p = (pointer)0x0;
  psVar2[1]._M_string_length = 0;
  psVar2[1].field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&psVar2[1].field_2 + 8) = 0;
  lVar3 = 0x10;
  do {
    *(long *)((long)psVar2 + lVar3 + -0x10) = (long)&(psVar2->_M_dataplus)._M_p + lVar3;
    *(undefined8 *)((long)psVar2 + lVar3 + -8) = 0;
    *(undefined1 *)((long)&(psVar2->_M_dataplus)._M_p + lVar3) = 0;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x50);
  stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_58,values);
  stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_38,values_1);
  lVar3 = 0;
  do {
    std::__cxx11::string::operator=
              ((string *)((long)&(psVar2->_M_dataplus)._M_p + lVar3),
               (string *)((long)&local_58._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x40);
  lVar3 = 0;
  do {
    pcVar1 = *(char **)((long)&local_38._M_dataplus._M_p + lVar3);
    if (local_38.field_2._M_local_buf + lVar3 != pcVar1) {
      operator_delete(pcVar1);
    }
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x40);
  return psVar2;
}

Assistant:

const std::string* DescriptorPool::Tables::AllocateStringArray(In&&... values) {
  auto& array = *arena_.Create<std::array<std::string, sizeof...(In)>>();
  array = {{std::string(std::forward<In>(values))...}};
  return array.data();
}